

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cc
# Opt level: O1

bool bloaty::TryGetJumpTarget(cs_arch arch,cs_insn *in,uint64_t *target)

{
  uint uVar1;
  x86_op_type xVar2;
  
  if ((arch == CS_ARCH_X86) &&
     (((uVar1 = in->id, uVar1 - 0xfd < 0x12 || (uVar1 == 0x110)) || (uVar1 == 0x38)))) {
    xVar2 = (in->detail->field_6).x86.operands[0].type;
    if (xVar2 == X86_OP_IMM) {
      *target = *(uint64_t *)&(in->detail->field_6).m68k.operands[1].mem.out_disp;
    }
    return xVar2 == X86_OP_IMM;
  }
  return false;
}

Assistant:

bool TryGetJumpTarget(cs_arch arch, cs_insn *in, uint64_t* target) {
  switch (arch) {
    case CS_ARCH_X86:
      switch (in->id) {
        case X86_INS_JAE:
        case X86_INS_JA:
        case X86_INS_JBE:
        case X86_INS_JB:
        case X86_INS_JCXZ:
        case X86_INS_JECXZ:
        case X86_INS_JE:
        case X86_INS_JGE:
        case X86_INS_JG:
        case X86_INS_JLE:
        case X86_INS_JL:
        case X86_INS_JMP:
        case X86_INS_JNE:
        case X86_INS_JNO:
        case X86_INS_JNP:
        case X86_INS_JNS:
        case X86_INS_JO:
        case X86_INS_JP:
        case X86_INS_JS:
        case X86_INS_CALL: {
          auto op0 = in->detail->x86.operands[0];
          if (op0.type == X86_OP_IMM) {
            *target = op0.imm;
            return true;
          }
          return false;
        }
        default:
          return false;
      }
    default:
      return false;
  }
}